

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolverTypes.h
# Opt level: O2

void __thiscall Minisat::MarkArray::~MarkArray(MarkArray *this)

{
  destroy(this);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)this);
  return;
}

Assistant:

~MarkArray() { destroy(); }